

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trajectory.hpp
# Opt level: O2

void __thiscall
ruckig::Trajectory<0UL,_ruckig::StandardVector>::at_time
          (Trajectory<0UL,_ruckig::StandardVector> *this,double time,Vector<double> *new_position,
          Vector<double> *new_velocity,Vector<double> *new_acceleration,Vector<double> *new_jerk,
          size_t *new_section)

{
  size_t sVar1;
  RuckigError *this_00;
  allocator<char> local_39;
  undefined1 local_38 [32];
  
  sVar1 = this->degrees_of_freedom;
  if ((((sVar1 == (long)(new_position->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(new_position->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 3) &&
       (sVar1 == (long)(new_velocity->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(new_velocity->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3)) &&
      (sVar1 == (long)(new_acceleration->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(new_acceleration->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3)) &&
     (sVar1 == (long)(new_jerk->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(new_jerk->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3)) {
    local_38._0_8_ = new_position;
    local_38._8_8_ = new_velocity;
    local_38._16_8_ = new_acceleration;
    local_38._24_8_ = new_jerk;
    Trajectory<0ul,ruckig::StandardVector>::
    state_to_integrate_from<ruckig::Trajectory<0ul,ruckig::StandardVector>::at_time(double,std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,unsigned_long&)const::_lambda(unsigned_long,double,double,double,double,double)_1_>
              ((Trajectory<0ul,ruckig::StandardVector> *)this,time,new_section,
               (anon_class_32_4_098e0619 *)local_38);
    return;
  }
  this_00 = (RuckigError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"mismatch in degrees of freedom (vector size).",&local_39);
  RuckigError::RuckigError(this_00,(string *)local_38);
  __cxa_throw(this_00,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void at_time(double time, Vector<double>& new_position, Vector<double>& new_velocity, Vector<double>& new_acceleration, Vector<double>& new_jerk, size_t& new_section) const {
        if constexpr (DOFs == 0) {
            if (degrees_of_freedom != new_position.size() || degrees_of_freedom != new_velocity.size() || degrees_of_freedom != new_acceleration.size() || degrees_of_freedom != new_jerk.size()) {
                throw RuckigError("mismatch in degrees of freedom (vector size).");
            }
        }

        state_to_integrate_from(time, new_section, [&](size_t dof, double t, double p, double v, double a, double j) {
            std::tie(new_position[dof], new_velocity[dof], new_acceleration[dof]) = integrate(t, p, v, a, j);
            new_jerk[dof] = j;
        });
    }